

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O3

int __thiscall Clasp::PropagatorList::remove(PropagatorList *this,char *__filename)

{
  int in_EAX;
  PostPropagator *pPVar1;
  PostPropagator *pPVar2;
  
  if (__filename == (char *)0x0) {
    Potassco::fail(-2,"void Clasp::PropagatorList::remove(PostPropagator *)",0x55,"p",
                   "Invalid post propagator",0);
  }
  pPVar2 = this->head_;
  if (pPVar2 != (PostPropagator *)0x0) {
    if (pPVar2 != (PostPropagator *)__filename) {
      do {
        pPVar1 = pPVar2;
        pPVar2 = pPVar1->next;
        if (pPVar2 == (PostPropagator *)0x0) {
          return in_EAX;
        }
      } while (pPVar2 != (PostPropagator *)__filename);
      this = (PropagatorList *)&pPVar1->next;
    }
    *this = (PropagatorList)pPVar2->next;
    __filename[8] = '\0';
    __filename[9] = '\0';
    __filename[10] = '\0';
    __filename[0xb] = '\0';
    __filename[0xc] = '\0';
    __filename[0xd] = '\0';
    __filename[0xe] = '\0';
    __filename[0xf] = '\0';
  }
  return in_EAX;
}

Assistant:

void PropagatorList::remove(PostPropagator* p) {
	POTASSCO_REQUIRE(p, "Invalid post propagator");
	for (PostPropagator** r = head(), *x; *r; r = &x->next) {
		if ((x = *r) == p) {
			*r      = x->next;
			p->next = 0;
			break;
		}
	}
}